

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fkScanChildren(Parse *pParse,SrcList *pSrc,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,
                   int regData,int nIncr)

{
  int iVar1;
  sqlite3 *db;
  Column *pCVar2;
  uint uVar3;
  int iVar4;
  Vdbe *p;
  Expr *pEVar5;
  sColMap *psVar6;
  Expr *pEVar7;
  WhereInfo *pWInfo;
  Parse *pPVar8;
  char *zC;
  sColMap *psVar9;
  long lVar10;
  NameContext sNameContext;
  Expr *local_b8;
  NameContext local_68;
  
  db = pParse->db;
  p = sqlite3GetVdbe(pParse);
  uVar3 = 0;
  if (nIncr < 0) {
    uVar3 = sqlite3VdbeAddOp3(p,0x76,(uint)pFKey->isDeferred,0,0);
  }
  if (pFKey->nCol < 1) {
    local_b8 = (Expr *)0x0;
  }
  else {
    lVar10 = 0;
    local_b8 = (Expr *)0x0;
    psVar9 = (sColMap *)aiCol;
    do {
      local_68.pParse = (Parse *)0x0;
      local_68.pSrcList = (SrcList *)((ulong)local_68.pSrcList & 0xffffffff00000000);
      pEVar5 = sqlite3ExprAlloc(db,0x84,(Token *)&local_68,0);
      if (pEVar5 == (Expr *)0x0) {
        pEVar5 = (Expr *)0x0;
      }
      else if (pIdx == (Index *)0x0) {
        pEVar5->iTable = regData;
        pEVar5->affinity = 'd';
      }
      else {
        iVar1 = pIdx->aiColumn[lVar10];
        pCVar2 = pTab->aCol;
        iVar4 = iVar1;
        if (iVar1 == pTab->iPKey) {
          iVar4 = -1;
        }
        pEVar5->iTable = iVar4 + regData + 1;
        pEVar5->affinity = pCVar2[iVar1].affinity;
        zC = pCVar2[iVar1].zColl;
        if (zC == (char *)0x0) {
          zC = db->pDfltColl->zName;
        }
        pEVar5 = sqlite3ExprAddCollateString(pParse,pEVar5,zC);
      }
      psVar6 = psVar9;
      if (aiCol == (int *)0x0) {
        psVar6 = pFKey->aCol;
      }
      pEVar7 = sqlite3Expr(db,0x1a,pFKey->pFrom->aCol[psVar6->iFrom].zName);
      pEVar5 = sqlite3PExpr(pParse,0x4c,pEVar5,pEVar7,(Token *)0x0);
      local_b8 = sqlite3ExprAnd(db,local_b8,pEVar5);
      lVar10 = lVar10 + 1;
      psVar9 = (sColMap *)&psVar9->field_0x4;
    } while (lVar10 < pFKey->nCol);
  }
  if ((0 < nIncr) && (pFKey->pFrom == pTab)) {
    local_68.pParse = (Parse *)0x0;
    local_68.pSrcList = (SrcList *)((ulong)local_68.pSrcList & 0xffffffff00000000);
    pEVar5 = sqlite3ExprAlloc(db,0x84,(Token *)&local_68,0);
    local_68.pParse = (Parse *)0x0;
    local_68.pSrcList = (SrcList *)((ulong)local_68.pSrcList & 0xffffffff00000000);
    pEVar7 = sqlite3ExprAlloc(db,0x98,(Token *)&local_68,0);
    if (pEVar7 != (Expr *)0x0 && pEVar5 != (Expr *)0x0) {
      pEVar5->iTable = regData;
      pEVar5->affinity = 'd';
      pEVar7->iTable = pSrc->a[0].iCursor;
      pEVar7->iColumn = -1;
    }
    pEVar5 = sqlite3PExpr(pParse,0x4b,pEVar5,pEVar7,(Token *)0x0);
    local_b8 = sqlite3ExprAnd(db,local_b8,pEVar5);
  }
  local_68.pNext = (NameContext *)0x0;
  local_68.nRef = 0;
  local_68.nErr = 0;
  local_68.pEList = (ExprList *)0x0;
  local_68.pAggInfo = (AggInfo *)0x0;
  local_68.ncFlags = '\0';
  local_68._49_7_ = 0;
  local_68.pParse = pParse;
  local_68.pSrcList = pSrc;
  sqlite3ResolveExprNames(&local_68,local_b8);
  pWInfo = sqlite3WhereBegin(pParse,pSrc,local_b8,(ExprList *)0x0,(ExprList *)0x0,0,0);
  if ((0 < nIncr) && (pFKey->isDeferred == '\0')) {
    pPVar8 = pParse->pToplevel;
    if (pParse->pToplevel == (Parse *)0x0) {
      pPVar8 = pParse;
    }
    pPVar8->mayAbort = '\x01';
  }
  sqlite3VdbeAddOp3(p,0x75,(uint)pFKey->isDeferred,nIncr,0);
  if (pWInfo != (WhereInfo *)0x0) {
    sqlite3WhereEnd(pWInfo);
  }
  sqlite3ExprDelete(db,local_b8);
  if ((0 < (int)uVar3) && (uVar3 < (uint)p->nOp)) {
    p->aOp[uVar3].p2 = p->nOp;
  }
  return;
}

Assistant:

static void fkScanChildren(
  Parse *pParse,                  /* Parse context */
  SrcList *pSrc,                  /* SrcList containing the table to scan */
  Table *pTab,
  Index *pIdx,                    /* Foreign key index */
  FKey *pFKey,                    /* Foreign key relationship */
  int *aiCol,                     /* Map from pIdx cols to child table cols */
  int regData,                    /* Referenced table data starts here */
  int nIncr                       /* Amount to increment deferred counter by */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  int i;                          /* Iterator variable */
  Expr *pWhere = 0;               /* WHERE clause to scan with */
  NameContext sNameContext;       /* Context used to resolve WHERE clause */
  WhereInfo *pWInfo;              /* Context used by sqlite3WhereXXX() */
  int iFkIfZero = 0;              /* Address of OP_FkIfZero */
  Vdbe *v = sqlite3GetVdbe(pParse);

  assert( !pIdx || pIdx->pTable==pTab );

  if( nIncr<0 ){
    iFkIfZero = sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, 0);
  }

  /* Create an Expr object representing an SQL expression like:
  **
  **   <parent-key1> = <child-key1> AND <parent-key2> = <child-key2> ...
  **
  ** The collation sequence used for the comparison should be that of
  ** the parent key columns. The affinity of the parent key column should
  ** be applied to each child key value before the comparison takes place.
  */
  for(i=0; i<pFKey->nCol; i++){
    Expr *pLeft;                  /* Value from parent table row */
    Expr *pRight;                 /* Column ref to child table */
    Expr *pEq;                    /* Expression (pLeft = pRight) */
    int iCol;                     /* Index of column in child table */ 
    const char *zCol;             /* Name of column in child table */

    pLeft = sqlite3Expr(db, TK_REGISTER, 0);
    if( pLeft ){
      /* Set the collation sequence and affinity of the LHS of each TK_EQ
      ** expression to the parent key column defaults.  */
      if( pIdx ){
        Column *pCol;
        const char *zColl;
        iCol = pIdx->aiColumn[i];
        pCol = &pTab->aCol[iCol];
        if( pTab->iPKey==iCol ) iCol = -1;
        pLeft->iTable = regData+iCol+1;
        pLeft->affinity = pCol->affinity;
        zColl = pCol->zColl;
        if( zColl==0 ) zColl = db->pDfltColl->zName;
        pLeft = sqlite3ExprAddCollateString(pParse, pLeft, zColl);
      }else{
        pLeft->iTable = regData;
        pLeft->affinity = SQLITE_AFF_INTEGER;
      }
    }
    iCol = aiCol ? aiCol[i] : pFKey->aCol[0].iFrom;
    assert( iCol>=0 );
    zCol = pFKey->pFrom->aCol[iCol].zName;
    pRight = sqlite3Expr(db, TK_ID, zCol);
    pEq = sqlite3PExpr(pParse, TK_EQ, pLeft, pRight, 0);
    pWhere = sqlite3ExprAnd(db, pWhere, pEq);
  }

  /* If the child table is the same as the parent table, and this scan
  ** is taking place as part of a DELETE operation (operation D.2), omit the
  ** row being deleted from the scan by adding ($rowid != rowid) to the WHERE 
  ** clause, where $rowid is the rowid of the row being deleted.  */
  if( pTab==pFKey->pFrom && nIncr>0 ){
    Expr *pEq;                    /* Expression (pLeft = pRight) */
    Expr *pLeft;                  /* Value from parent table row */
    Expr *pRight;                 /* Column ref to child table */
    pLeft = sqlite3Expr(db, TK_REGISTER, 0);
    pRight = sqlite3Expr(db, TK_COLUMN, 0);
    if( pLeft && pRight ){
      pLeft->iTable = regData;
      pLeft->affinity = SQLITE_AFF_INTEGER;
      pRight->iTable = pSrc->a[0].iCursor;
      pRight->iColumn = -1;
    }
    pEq = sqlite3PExpr(pParse, TK_NE, pLeft, pRight, 0);
    pWhere = sqlite3ExprAnd(db, pWhere, pEq);
  }

  /* Resolve the references in the WHERE clause. */
  memset(&sNameContext, 0, sizeof(NameContext));
  sNameContext.pSrcList = pSrc;
  sNameContext.pParse = pParse;
  sqlite3ResolveExprNames(&sNameContext, pWhere);

  /* Create VDBE to loop through the entries in pSrc that match the WHERE
  ** clause. If the constraint is not deferred, throw an exception for
  ** each row found. Otherwise, for deferred constraints, increment the
  ** deferred constraint counter by nIncr for each row selected.  */
  pWInfo = sqlite3WhereBegin(pParse, pSrc, pWhere, 0, 0, 0, 0);
  if( nIncr>0 && pFKey->isDeferred==0 ){
    sqlite3ParseToplevel(pParse)->mayAbort = 1;
  }
  sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
  if( pWInfo ){
    sqlite3WhereEnd(pWInfo);
  }

  /* Clean up the WHERE clause constructed above. */
  sqlite3ExprDelete(db, pWhere);
  if( iFkIfZero ){
    sqlite3VdbeJumpHere(v, iFkIfZero);
  }
}